

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O3

void __thiscall duckdb::ColumnData::RevertAppend(ColumnData *this,row_t start_row)

{
  vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_true> *this_00;
  pointer pSVar1;
  compression_revert_append_t p_Var2;
  const_iterator __cbeg;
  reference pvVar3;
  unsigned_long uVar4;
  idx_t index;
  ColumnSegment *pCVar5;
  long lVar6;
  _Head_base<0UL,_duckdb::ColumnSegment_*,_false> _Var7;
  SegmentLock l;
  unique_lock<std::mutex> local_38;
  
  local_38._M_device = &(this->data).super_SegmentTree<duckdb::ColumnSegment,_false>.node_lock;
  local_38._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_38);
  local_38._M_owns = true;
  this_00 = &(this->data).super_SegmentTree<duckdb::ColumnSegment,_false>.nodes;
  if ((this->data).super_SegmentTree<duckdb::ColumnSegment,_false>.nodes.
      super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
      .
      super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      *(pointer *)
       ((long)&(this->data).super_SegmentTree<duckdb::ColumnSegment,_false>.nodes.
               super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
               .
               super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
               ._M_impl.super__Vector_impl_data + 8)) {
    _Var7._M_head_impl = (ColumnSegment *)0x0;
  }
  else {
    pvVar3 = vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_true>::back(this_00);
    _Var7._M_head_impl =
         (pvVar3->node).
         super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
         super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>
         .super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl;
  }
  uVar4 = NumericCastImpl<unsigned_long,_long,_false>::Convert(start_row);
  if (uVar4 < ((_Var7._M_head_impl)->super_SegmentBase<duckdb::ColumnSegment>).count.
              super___atomic_base<unsigned_long>._M_i +
              ((_Var7._M_head_impl)->super_SegmentBase<duckdb::ColumnSegment>).start) {
    index = SegmentTree<duckdb::ColumnSegment,_false>::GetSegmentIndex
                      (&(this->data).super_SegmentTree<duckdb::ColumnSegment,_false>,
                       (SegmentLock *)&local_38,start_row);
    pCVar5 = SegmentTree<duckdb::ColumnSegment,_false>::GetSegmentByIndex
                       (&(this->data).super_SegmentTree<duckdb::ColumnSegment,_false>,
                        (SegmentLock *)&local_38,index);
    pSVar1 = (this->data).super_SegmentTree<duckdb::ColumnSegment,_false>.nodes.
             super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
             .
             super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar6 = (long)*(pointer *)
                   ((long)&(this->data).super_SegmentTree<duckdb::ColumnSegment,_false>.nodes.
                           super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
                           .
                           super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
                           ._M_impl.super__Vector_impl_data + 8) - (long)pSVar1;
    if (index < (lVar6 >> 4) - 1U) {
      ::std::
      vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
      ::_M_erase(&this_00->
                  super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
                 ,pSVar1 + index + 1,(SegmentNode<duckdb::ColumnSegment> *)(lVar6 + (long)pSVar1));
    }
    LOCK();
    (this->count).super___atomic_base<unsigned_long>._M_i = start_row - this->start;
    UNLOCK();
    LOCK();
    (pCVar5->super_SegmentBase<duckdb::ColumnSegment>).next._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    p_Var2 = ((pCVar5->function)._M_data)->revert_append;
    if (p_Var2 != (compression_revert_append_t)0x0) {
      (*p_Var2)(pCVar5,start_row);
    }
    LOCK();
    (pCVar5->super_SegmentBase<duckdb::ColumnSegment>).count.super___atomic_base<unsigned_long>._M_i
         = start_row - (pCVar5->super_SegmentBase<duckdb::ColumnSegment>).start;
    UNLOCK();
  }
  ::std::unique_lock<std::mutex>::~unique_lock(&local_38);
  return;
}

Assistant:

void ColumnData::RevertAppend(row_t start_row) {
	auto l = data.Lock();
	// check if this row is in the segment tree at all
	auto last_segment = data.GetLastSegment(l);
	if (NumericCast<idx_t>(start_row) >= last_segment->start + last_segment->count) {
		// the start row is equal to the final portion of the column data: nothing was ever appended here
		D_ASSERT(NumericCast<idx_t>(start_row) == last_segment->start + last_segment->count);
		return;
	}
	// find the segment index that the current row belongs to
	idx_t segment_index = data.GetSegmentIndex(l, UnsafeNumericCast<idx_t>(start_row));
	auto segment = data.GetSegmentByIndex(l, UnsafeNumericCast<int64_t>(segment_index));
	auto &transient = *segment;
	D_ASSERT(transient.segment_type == ColumnSegmentType::TRANSIENT);

	// remove any segments AFTER this segment: they should be deleted entirely
	data.EraseSegments(l, segment_index);

	this->count = UnsafeNumericCast<idx_t>(start_row) - this->start;
	segment->next = nullptr;
	transient.RevertAppend(UnsafeNumericCast<idx_t>(start_row));
}